

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void predict_and_reconstruct_intra_block
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r,int plane,int row,int col,
               TX_SIZE tx_size)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int stride;
  MB_MODE_INFO *pMVar5;
  MB_MODE_INFO *pMVar6;
  tran_low_t *ptVar7;
  byte tx_type;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  
  pMVar5 = *(dcb->xd).mi;
  uVar9 = (ulong)tx_size;
  av1_predict_intra_block_facade(cm,&dcb->xd,plane,col,row,tx_size);
  if (pMVar5->skip_txfm == '\0') {
    uVar2 = dcb->eob_data[plane][dcb->txb_offset[plane]].eob;
    if (uVar2 != 0) {
      bVar1 = (cm->features).reduced_tx_set_used;
      pMVar6 = *(dcb->xd).mi;
      if (((dcb->xd).lossless[*(ushort *)&pMVar6->field_0xa7 & 7] == 0) &&
         ((0x61810UL >> (uVar9 & 0x3f) & 1) == 0)) {
        if (plane == 0) {
          tx_type = (dcb->xd).tx_type_map[(dcb->xd).tx_type_map_stride * row + col];
        }
        else {
          cVar10 = (char)*(ushort *)&pMVar6->field_0xa7;
          if ((cVar10 < '\0') || ('\0' < pMVar6->ref_frame[0])) {
            tx_type = (dcb->xd).tx_type_map
                      [(row << ((byte)(dcb->xd).plane[1].subsampling_y & 0x1f)) *
                       (dcb->xd).tx_type_map_stride +
                       (col << ((byte)(dcb->xd).plane[1].subsampling_x & 0x1f))];
            uVar8 = 1;
            if (-1 < cVar10) {
              uVar8 = (uint)('\0' < pMVar6->ref_frame[0]);
            }
          }
          else {
            tx_type = intra_mode_to_tx_type__intra_mode_to_tx_type
                      [(byte)get_uv_mode_uv2y[pMVar6->uv_mode]];
            uVar8 = 0;
          }
          if ((0x18608UL >> (uVar9 & 0x3f) & 1) == 0) {
            if (bVar1 == false) {
              uVar8 = (uint)av1_ext_tx_set_lookup[0]
                            [(ulong)((0x60604UL >> (uVar9 & 0x3f) & 1) != 0) + (ulong)(uVar8 * 2)];
            }
            else {
              uVar8 = (uint)(byte)((uVar8 == 0) + 1);
            }
          }
          if (*(int *)((long)av1_ext_tx_used[0] + (ulong)tx_type * 4 + (ulong)(uVar8 << 6)) == 0) {
            tx_type = 0;
          }
        }
      }
      else {
        tx_type = 0;
      }
      stride = (dcb->xd).plane[plane].dst.stride;
      uVar3 = dcb->cb_offset[plane];
      ptVar7 = dcb->dqcoeff_block[plane];
      uVar4 = dcb->eob_data[plane][dcb->txb_offset[plane]].max_scan_line;
      av1_inverse_transform_block
                (&dcb->xd,ptVar7 + uVar3,plane,tx_type,tx_size,
                 (dcb->xd).plane[plane].dst.buf + (stride * row + col) * 4,stride,(uint)uVar2,
                 (uint)bVar1);
      memset(ptVar7 + uVar3,0,(ulong)uVar4 * 4 + 4);
    }
  }
  if (((plane == 0) && (cm->seq_params->monochrome == '\0')) &&
     (((dcb->xd).is_chroma_ref != true ||
      (((pMVar6 = *(dcb->xd).mi, (pMVar6->field_0xa7 & 0x80) == 0 && (pMVar6->ref_frame[0] < '\x01')
        ) && (pMVar6->uv_mode == '\r')))))) {
    cfl_store_tx(&dcb->xd,row,col,tx_size,pMVar5->bsize);
    return;
  }
  return;
}

Assistant:

static inline void predict_and_reconstruct_intra_block(
    const AV1_COMMON *const cm, DecoderCodingBlock *dcb, aom_reader *const r,
    const int plane, const int row, const int col, const TX_SIZE tx_size) {
  (void)r;
  MACROBLOCKD *const xd = &dcb->xd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  PLANE_TYPE plane_type = get_plane_type(plane);

  av1_predict_intra_block_facade(cm, xd, plane, col, row, tx_size);

  if (!mbmi->skip_txfm) {
    eob_info *eob_data = dcb->eob_data[plane] + dcb->txb_offset[plane];
    if (eob_data->eob) {
      const bool reduced_tx_set_used = cm->features.reduced_tx_set_used;
      // tx_type was read out in av1_read_coeffs_txb.
      const TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, row, col, tx_size,
                                              reduced_tx_set_used);
      struct macroblockd_plane *const pd = &xd->plane[plane];
      uint8_t *dst = &pd->dst.buf[(row * pd->dst.stride + col) << MI_SIZE_LOG2];
      inverse_transform_block(dcb, plane, tx_type, tx_size, dst, pd->dst.stride,
                              reduced_tx_set_used);
    }
  }
  if (plane == AOM_PLANE_Y && store_cfl_required(cm, xd)) {
    cfl_store_tx(xd, row, col, tx_size, mbmi->bsize);
  }
}